

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O3

bool cmMathCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmMakefile *this;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_t sVar10;
  long *plVar11;
  size_type *psVar12;
  size_type *psVar13;
  char *__format;
  string *name;
  string_view value;
  string_view value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmExprParserHelper helper;
  string e;
  long *local_560;
  long local_558;
  long local_550;
  long lStack_548;
  long *local_540;
  long local_538;
  long local_530;
  long lStack_528;
  long *local_520 [2];
  long local_510 [2];
  string *local_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  cmExprParserHelper local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438,"must be called with at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0033752e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p == &local_438[0].field_2) {
      return false;
    }
LAB_0033753b:
    operator_delete(local_438[0]._M_dataplus._M_p,
                    (ulong)(local_438[0].field_2._M_allocated_capacity + 1));
    return false;
  }
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 != 0) {
    std::operator+(local_438,"does not recognize sub-command ",__rhs);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p == &local_438[0].field_2) {
      return false;
    }
    goto LAB_0033753b;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if ((lVar7 != 3) && (lVar7 != 5)) {
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    local_4d8.InputBufferPos = 0x25;
    local_438[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_438,(ulong)&local_4d8);
    local_438[0].field_2._M_allocated_capacity = local_4d8.InputBufferPos;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x10) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x11) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x12) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x13) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x14) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x15) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x16) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x17) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x18) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x19) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1a) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1b) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1c) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1d) = 'g';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1e) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1f) = 'm';
    *(undefined8 *)local_438[0]._M_dataplus._M_p = 0x6c61632052505845;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 8) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 10) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0xb) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0xc) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0xd) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0xe) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0xf) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1d) = 'g';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1e) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x1f) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x20) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x21) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x22) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x23) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p + 0x24) = '.';
    local_438[0]._M_string_length = local_4d8.InputBufferPos;
    local_438[0]._M_dataplus._M_p[local_4d8.InputBufferPos] = '\0';
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0033752e;
  }
  name = pbVar1 + 1;
  value._M_str = "ERROR";
  value._M_len = 5;
  cmMakefile::AddDefinition(status->Makefile,name,value);
  iVar5 = 0;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x61) goto LAB_00337a57;
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  local_4d8.InputBufferPos = (size_type)&DAT_00000011;
  local_438[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_438,(ulong)&local_4d8);
  local_438[0].field_2._M_allocated_capacity = local_4d8.InputBufferPos;
  *(undefined8 *)local_438[0]._M_dataplus._M_p = 0x6d6d6f632d627573;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 8) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 9) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 10) = 'd';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 0xb) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 0xc) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 0xd) = 'X';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 0xe) = 'P';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p + 0xf) = 'R';
  local_438[0]._M_dataplus._M_p[0x10] = ' ';
  local_438[0]._M_string_length = local_4d8.InputBufferPos;
  local_438[0]._M_dataplus._M_p[local_4d8.InputBufferPos] = '\0';
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = std::__cxx11::string::compare((char *)(pbVar2 + 3));
  local_500 = name;
  if (iVar5 == 0) {
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x81) {
      local_560 = &local_550;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_560,local_438[0]._M_dataplus._M_p,
                 (char *)(local_438[0]._M_string_length + (long)local_438[0]._M_dataplus._M_p));
      std::__cxx11::string::append((char *)&local_560);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_560,(ulong)pbVar2[3]._M_dataplus._M_p);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_530 = *plVar11;
        lStack_528 = plVar8[3];
        local_540 = &local_530;
      }
      else {
        local_530 = *plVar11;
        local_540 = (long *)*plVar8;
      }
      local_538 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_540);
      local_4d8.InputBufferPos = (size_type)&local_4d8.InputBuffer._M_string_length;
      psVar12 = puVar9 + 2;
      if ((size_type *)*puVar9 == psVar12) {
        local_4d8.InputBuffer._M_string_length = *psVar12;
        local_4d8.InputBuffer.field_2._M_allocated_capacity = puVar9[3];
      }
      else {
        local_4d8.InputBuffer._M_string_length = *psVar12;
        local_4d8.InputBufferPos = (size_type)*puVar9;
      }
      local_4d8.InputBuffer._M_dataplus._M_p = (pointer)puVar9[1];
      *puVar9 = psVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if (local_540 != &local_530) {
        operator_delete(local_540,local_530 + 1);
      }
      if (local_560 != &local_550) {
        operator_delete(local_560,local_550 + 1);
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00337a01;
    }
    iVar5 = std::__cxx11::string::compare((char *)(pbVar3 + 4));
    bVar4 = true;
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)(pbVar3 + 4));
      if (iVar5 == 0) {
        iVar5 = 2;
        goto LAB_00337a24;
      }
      local_520[0] = local_510;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_520,local_438[0]._M_dataplus._M_p,
                 (char *)(local_438[0]._M_string_length + (long)local_438[0]._M_dataplus._M_p));
      std::__cxx11::string::append((char *)local_520);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_520,(ulong)pbVar3[4]._M_dataplus._M_p);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_4e8 = *plVar11;
        lStack_4e0 = plVar8[3];
        local_4f8 = &local_4e8;
      }
      else {
        local_4e8 = *plVar11;
        local_4f8 = (long *)*plVar8;
      }
      local_4f0 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_4f8);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_550 = *plVar11;
        lStack_548 = plVar8[3];
        local_560 = &local_550;
      }
      else {
        local_550 = *plVar11;
        local_560 = (long *)*plVar8;
      }
      local_558 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_560,(ulong)pbVar2[3]._M_dataplus._M_p);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_530 = *plVar11;
        lStack_528 = plVar8[3];
        local_540 = &local_530;
      }
      else {
        local_530 = *plVar11;
        local_540 = (long *)*plVar8;
      }
      local_538 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_540);
      psVar12 = &local_4d8.InputBuffer._M_string_length;
      psVar13 = puVar9 + 2;
      if ((size_type *)*puVar9 == psVar13) {
        local_4d8.InputBuffer._M_string_length = *psVar13;
        local_4d8.InputBuffer.field_2._M_allocated_capacity = puVar9[3];
        local_4d8.InputBufferPos = (size_type)psVar12;
      }
      else {
        local_4d8.InputBuffer._M_string_length = *psVar13;
        local_4d8.InputBufferPos = (size_type)*puVar9;
      }
      local_4d8.InputBuffer._M_dataplus._M_p = (pointer)puVar9[1];
      *puVar9 = psVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if (local_540 != &local_530) {
        operator_delete(local_540,local_530 + 1);
      }
      if (local_560 != &local_550) {
        operator_delete(local_560,local_550 + 1);
      }
      if (local_4f8 != &local_4e8) {
        operator_delete(local_4f8,local_4e8 + 1);
      }
      if (local_520[0] != local_510) {
        operator_delete(local_520[0],local_510[0] + 1);
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((size_type *)local_4d8.InputBufferPos != psVar12) goto LAB_00337a0e;
      goto LAB_00337a1e;
    }
    iVar5 = 1;
  }
  else {
    local_560 = &local_550;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,local_438[0]._M_dataplus._M_p,
               (char *)(local_438[0]._M_string_length + (long)local_438[0]._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_560);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_560,(ulong)pbVar2[3]._M_dataplus._M_p);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_530 = *plVar11;
      lStack_528 = plVar8[3];
      local_540 = &local_530;
    }
    else {
      local_530 = *plVar11;
      local_540 = (long *)*plVar8;
    }
    local_538 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_540);
    local_4d8.InputBufferPos = (size_type)&local_4d8.InputBuffer._M_string_length;
    psVar12 = puVar9 + 2;
    if ((size_type *)*puVar9 == psVar12) {
      local_4d8.InputBuffer._M_string_length = *psVar12;
      local_4d8.InputBuffer.field_2._M_allocated_capacity = puVar9[3];
    }
    else {
      local_4d8.InputBuffer._M_string_length = *psVar12;
      local_4d8.InputBufferPos = (size_type)*puVar9;
    }
    local_4d8.InputBuffer._M_dataplus._M_p = (pointer)puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if (local_540 != &local_530) {
      operator_delete(local_540,local_530 + 1);
    }
    if (local_560 != &local_550) {
      operator_delete(local_560,local_550 + 1);
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00337a01:
    if ((size_type *)local_4d8.InputBufferPos != &local_4d8.InputBuffer._M_string_length) {
LAB_00337a0e:
      operator_delete((void *)local_4d8.InputBufferPos,local_4d8.InputBuffer._M_string_length + 1);
    }
LAB_00337a1e:
    iVar5 = 0;
    bVar4 = false;
  }
LAB_00337a24:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,
                    (ulong)(local_438[0].field_2._M_allocated_capacity + 1));
  }
  name = local_500;
  if (!bVar4) {
    return false;
  }
LAB_00337a57:
  cmExprParserHelper::cmExprParserHelper(&local_4d8);
  iVar6 = cmExprParserHelper::ParseString(&local_4d8,pbVar1[2]._M_dataplus._M_p,0);
  if (iVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_438,local_4d8.ErrorString._M_dataplus._M_p,
               (allocator<char> *)&local_540);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
      operator_delete(local_438[0]._M_dataplus._M_p,
                      (ulong)(local_438[0].field_2._M_allocated_capacity + 1));
    }
  }
  else {
    __format = "%ld";
    if (iVar5 == 2) {
      __format = "0x%lx";
    }
    snprintf((char *)local_438,0x400,__format,local_4d8.Result);
    if (local_4d8.WarningString._M_string_length != 0) {
      cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&local_4d8.WarningString);
    }
    this = status->Makefile;
    sVar10 = strlen((char *)local_438);
    value_00._M_str = (char *)local_438;
    value_00._M_len = sVar10;
    cmMakefile::AddDefinition(this,name,value_00);
  }
  cmExprParserHelper::~cmExprParserHelper(&local_4d8);
  return iVar6 != 0;
}

Assistant:

bool cmMathCommand(std::vector<std::string> const& args,
                   cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  const std::string& subCommand = args[0];
  if (subCommand == "EXPR") {
    return HandleExprCommand(args, status);
  }
  std::string e = "does not recognize sub-command " + subCommand;
  status.SetError(e);
  return false;
}